

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O3

void glob_cleanup(URLGlob *glob)

{
  char **__ptr;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (glob != (URLGlob *)0x0) {
    uVar2 = glob->size;
    if (uVar2 != 0) {
      uVar3 = 0;
      do {
        if (glob->pattern[uVar3].type == UPTSet) {
          __ptr = glob->pattern[uVar3].content.Set.elements;
          if (__ptr != (char **)0x0) {
            lVar1 = (long)glob->pattern[uVar3].content.Set.size;
            if (0 < lVar1) {
              uVar2 = lVar1 + 1;
              do {
                free(*(void **)((glob->pattern[uVar3].content.NumRange.min_n - 0x10) + uVar2 * 8));
                *(undefined8 *)((glob->pattern[uVar3].content.NumRange.min_n - 0x10) + uVar2 * 8) =
                     0;
                uVar2 = uVar2 - 1;
              } while (1 < uVar2);
              __ptr = glob->pattern[uVar3].content.Set.elements;
            }
            free(__ptr);
            glob->pattern[uVar3].content.Set.elements = (char **)0x0;
            uVar2 = glob->size;
          }
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2);
    }
    free(glob->glob_buffer);
    free(glob);
    return;
  }
  return;
}

Assistant:

void glob_cleanup(URLGlob* glob)
{
  size_t i;
  int elem;

  if(!glob)
    return;

  for(i = 0; i < glob->size; i++) {
    if((glob->pattern[i].type == UPTSet) &&
       (glob->pattern[i].content.Set.elements)) {
      for(elem = glob->pattern[i].content.Set.size - 1;
          elem >= 0;
          --elem) {
        Curl_safefree(glob->pattern[i].content.Set.elements[elem]);
      }
      Curl_safefree(glob->pattern[i].content.Set.elements);
    }
  }
  Curl_safefree(glob->glob_buffer);
  Curl_safefree(glob);
}